

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

exr_result_t validate_tile_data(exr_context_t f,exr_priv_part_t curpart)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  exr_attribute_t *peVar6;
  exr_attr_tiledesc_t *peVar7;
  exr_attr_chlist_t *peVar8;
  exr_attr_chlist_entry_t *peVar9;
  ulong uVar10;
  exr_result_t eVar11;
  ulong uVar12;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  ulong uVar13;
  undefined8 uVar14;
  char *pcVar15;
  exr_result_t eStack_8;
  
  if ((curpart->storage_mode | EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_DEEP_TILED) {
    return 0;
  }
  peVar6 = curpart->tiles;
  if (peVar6 == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = f->print_error;
    pcVar15 = "\'tiles\' attribute for tiled file not found";
    eStack_8 = 0xd;
  }
  else {
    if (peVar6->type == EXR_ATTR_TILEDESC) {
      peVar7 = (peVar6->field_6).tiledesc;
      uVar2 = peVar7->x_size;
      uVar3 = peVar7->y_size;
      if ((uVar2 == 0) || (0x1fffffff < uVar2 || uVar3 + 0xe0000000 < 0xe0000001)) {
        UNRECOVERED_JUMPTABLE_00 = f->print_error;
        pcVar15 = "Invalid tile description size (%u x %u)";
        uVar4 = uVar3;
      }
      else {
        uVar4 = f->max_tile_w;
        uVar5 = f->max_tile_h;
        peVar8 = (curpart->channels->field_6).chlist;
        bVar1 = peVar7->level_and_round;
        if (((int)uVar4 < 1) || ((int)uVar2 <= (int)uVar4)) {
          if ((0 < (int)uVar5) && (uVar5 < uVar3)) {
            eVar11 = (*f->print_error)(f,0xe,"Width of tile exceeds max size (%d vs max %d)",
                                       (ulong)uVar3,(ulong)uVar5);
            return eVar11;
          }
          uVar12 = (ulong)(bVar1 & 0xf);
          if ((bVar1 & 0xf) < 3) {
            if (bVar1 < 0x20) {
              uVar2 = peVar8->num_channels;
              uVar12 = (ulong)uVar2;
              if ((int)uVar2 < 1) {
                uVar12 = 0;
              }
              uVar10 = 0;
              while( true ) {
                uVar13 = uVar10;
                if (uVar12 * 0x20 + 0x20 == uVar13 + 0x20) {
                  return 0;
                }
                peVar9 = peVar8->entries;
                if (*(int *)(peVar9->reserved + uVar13 + 3) != 1) break;
                uVar10 = uVar13 + 0x20;
                if (*(int *)(peVar9->reserved + uVar13 + 7) != 1) {
                  UNRECOVERED_JUMPTABLE_00 = f->print_error;
                  uVar14 = *(undefined8 *)(peVar9->reserved + (uVar13 - 0xd));
                  pcVar15 = "channel \'%s\': y subsampling factor is not 1 (%d) for a tiled image";
LAB_0012b91b:
                  eVar11 = (*UNRECOVERED_JUMPTABLE_00)(f,0xe,pcVar15,uVar14);
                  return eVar11;
                }
              }
              UNRECOVERED_JUMPTABLE_00 = f->print_error;
              uVar14 = *(undefined8 *)(peVar9->reserved + (uVar13 - 0xd));
              pcVar15 = "channel \'%s\': x subsampling factor is not 1 (%d) for a tiled image";
              goto LAB_0012b91b;
            }
            UNRECOVERED_JUMPTABLE_00 = f->print_error;
            pcVar15 = "Invalid rounding mode (%d) in tile description header";
            uVar12 = (ulong)(bVar1 >> 4);
          }
          else {
            UNRECOVERED_JUMPTABLE_00 = f->print_error;
            pcVar15 = "Invalid level mode (%d) in tile description header";
          }
          eVar11 = (*UNRECOVERED_JUMPTABLE_00)(f,0xe,pcVar15,uVar12,UNRECOVERED_JUMPTABLE_00);
          return eVar11;
        }
        UNRECOVERED_JUMPTABLE_00 = f->print_error;
        pcVar15 = "Width of tile exceeds max size (%d vs max %d)";
      }
      eVar11 = (*UNRECOVERED_JUMPTABLE_00)
                         (f,0xe,pcVar15,(ulong)uVar2,(ulong)uVar4,UNRECOVERED_JUMPTABLE_00);
      return eVar11;
    }
    UNRECOVERED_JUMPTABLE_00 = f->print_error;
    pcVar15 = "\'tiles\' attribute has wrong data type, expect tile description";
    eStack_8 = 0x10;
  }
  eVar11 = (*UNRECOVERED_JUMPTABLE_00)(f,eStack_8,pcVar15,UNRECOVERED_JUMPTABLE_00);
  return eVar11;
}

Assistant:

static exr_result_t
validate_tile_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_TILED ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* desc;
        const int                  maxtilew = f->max_tile_w;
        const int                  maxtileh = f->max_tile_h;
        const exr_attr_chlist_t*   channels = curpart->channels->chlist;
        exr_tile_level_mode_t      levmode;
        exr_tile_round_mode_t      rndmode;

        if (!curpart->tiles)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'tiles' attribute for tiled file not found");
        else if (curpart->tiles->type != EXR_ATTR_TILEDESC)
            return f->print_error (
                f,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'tiles' attribute has wrong data type, expect tile description");

        desc    = curpart->tiles->tiledesc;
        levmode = EXR_GET_TILE_LEVEL_MODE (*desc);
        rndmode = EXR_GET_TILE_ROUND_MODE (*desc);

        if (desc->x_size == 0 || desc->y_size == 0 ||
            desc->x_size > (uint32_t) (INT_MAX / 4) ||
            desc->y_size > (uint32_t) (INT_MAX / 4))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid tile description size (%u x %u)",
                desc->x_size,
                desc->y_size);
        if (maxtilew > 0 && maxtilew < (int) (desc->x_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->x_size,
                maxtilew);
        if (maxtileh > 0 && maxtileh < (int) (desc->y_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->y_size,
                maxtileh);

        if ((int) levmode < EXR_TILE_ONE_LEVEL ||
            (int) levmode >= EXR_TILE_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid level mode (%d) in tile description header",
                (int) levmode);

        if ((int) rndmode < EXR_TILE_ROUND_DOWN ||
            (int) rndmode >= EXR_TILE_ROUND_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid rounding mode (%d) in tile description header",
                (int) rndmode);

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}